

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O1

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::DuplicateColsPS::DuplicateColsPS(DuplicateColsPS *this,DuplicateColsPS *old)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  int32_t iVar5;
  
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__PostStep_003b5810;
  (this->super_PostStep).m_name = (old->super_PostStep).m_name;
  iVar4 = (old->super_PostStep).nRows;
  (this->super_PostStep).nCols = (old->super_PostStep).nCols;
  (this->super_PostStep).nRows = iVar4;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (old->super_PostStep)._tolerances.
       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_PostStep)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(old->super_PostStep)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__DuplicateColsPS_003b6150;
  iVar4 = old->m_k;
  this->m_j = old->m_j;
  this->m_k = iVar4;
  *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 8) =
       *(undefined8 *)((old->m_loJ).m_backend.data._M_elems + 8);
  uVar1 = *(undefined8 *)(old->m_loJ).m_backend.data._M_elems;
  uVar2 = *(undefined8 *)((old->m_loJ).m_backend.data._M_elems + 2);
  uVar3 = *(undefined8 *)((old->m_loJ).m_backend.data._M_elems + 6);
  *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 4) =
       *(undefined8 *)((old->m_loJ).m_backend.data._M_elems + 4);
  *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 6) = uVar3;
  *(undefined8 *)(this->m_loJ).m_backend.data._M_elems = uVar1;
  *(undefined8 *)((this->m_loJ).m_backend.data._M_elems + 2) = uVar2;
  (this->m_loJ).m_backend.exp = (old->m_loJ).m_backend.exp;
  (this->m_loJ).m_backend.neg = (old->m_loJ).m_backend.neg;
  iVar5 = (old->m_loJ).m_backend.prec_elem;
  (this->m_loJ).m_backend.fpclass = (old->m_loJ).m_backend.fpclass;
  (this->m_loJ).m_backend.prec_elem = iVar5;
  uVar1 = *(undefined8 *)((old->m_upJ).m_backend.data._M_elems + 2);
  uVar2 = *(undefined8 *)((old->m_upJ).m_backend.data._M_elems + 4);
  uVar3 = *(undefined8 *)((old->m_upJ).m_backend.data._M_elems + 6);
  *(undefined8 *)(this->m_upJ).m_backend.data._M_elems =
       *(undefined8 *)(old->m_upJ).m_backend.data._M_elems;
  *(undefined8 *)((this->m_upJ).m_backend.data._M_elems + 2) = uVar1;
  *(undefined8 *)((this->m_upJ).m_backend.data._M_elems + 4) = uVar2;
  *(undefined8 *)((this->m_upJ).m_backend.data._M_elems + 6) = uVar3;
  *(undefined8 *)((this->m_upJ).m_backend.data._M_elems + 8) =
       *(undefined8 *)((old->m_upJ).m_backend.data._M_elems + 8);
  (this->m_upJ).m_backend.exp = (old->m_upJ).m_backend.exp;
  (this->m_upJ).m_backend.neg = (old->m_upJ).m_backend.neg;
  iVar5 = (old->m_upJ).m_backend.prec_elem;
  (this->m_upJ).m_backend.fpclass = (old->m_upJ).m_backend.fpclass;
  (this->m_upJ).m_backend.prec_elem = iVar5;
  uVar1 = *(undefined8 *)((old->m_loK).m_backend.data._M_elems + 2);
  uVar2 = *(undefined8 *)((old->m_loK).m_backend.data._M_elems + 4);
  uVar3 = *(undefined8 *)((old->m_loK).m_backend.data._M_elems + 6);
  *(undefined8 *)(this->m_loK).m_backend.data._M_elems =
       *(undefined8 *)(old->m_loK).m_backend.data._M_elems;
  *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 2) = uVar1;
  *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 4) = uVar2;
  *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 6) = uVar3;
  *(undefined8 *)((this->m_loK).m_backend.data._M_elems + 8) =
       *(undefined8 *)((old->m_loK).m_backend.data._M_elems + 8);
  (this->m_loK).m_backend.exp = (old->m_loK).m_backend.exp;
  (this->m_loK).m_backend.neg = (old->m_loK).m_backend.neg;
  iVar5 = (old->m_loK).m_backend.prec_elem;
  (this->m_loK).m_backend.fpclass = (old->m_loK).m_backend.fpclass;
  (this->m_loK).m_backend.prec_elem = iVar5;
  uVar1 = *(undefined8 *)((old->m_upK).m_backend.data._M_elems + 2);
  uVar2 = *(undefined8 *)((old->m_upK).m_backend.data._M_elems + 4);
  uVar3 = *(undefined8 *)((old->m_upK).m_backend.data._M_elems + 6);
  *(undefined8 *)(this->m_upK).m_backend.data._M_elems =
       *(undefined8 *)(old->m_upK).m_backend.data._M_elems;
  *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 2) = uVar1;
  *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 4) = uVar2;
  *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 6) = uVar3;
  *(undefined8 *)((this->m_upK).m_backend.data._M_elems + 8) =
       *(undefined8 *)((old->m_upK).m_backend.data._M_elems + 8);
  (this->m_upK).m_backend.exp = (old->m_upK).m_backend.exp;
  (this->m_upK).m_backend.neg = (old->m_upK).m_backend.neg;
  iVar5 = (old->m_upK).m_backend.prec_elem;
  (this->m_upK).m_backend.fpclass = (old->m_upK).m_backend.fpclass;
  (this->m_upK).m_backend.prec_elem = iVar5;
  uVar1 = *(undefined8 *)((old->m_scale).m_backend.data._M_elems + 2);
  uVar2 = *(undefined8 *)((old->m_scale).m_backend.data._M_elems + 4);
  uVar3 = *(undefined8 *)((old->m_scale).m_backend.data._M_elems + 6);
  *(undefined8 *)(this->m_scale).m_backend.data._M_elems =
       *(undefined8 *)(old->m_scale).m_backend.data._M_elems;
  *(undefined8 *)((this->m_scale).m_backend.data._M_elems + 2) = uVar1;
  *(undefined8 *)((this->m_scale).m_backend.data._M_elems + 4) = uVar2;
  *(undefined8 *)((this->m_scale).m_backend.data._M_elems + 6) = uVar3;
  *(undefined8 *)((this->m_scale).m_backend.data._M_elems + 8) =
       *(undefined8 *)((old->m_scale).m_backend.data._M_elems + 8);
  (this->m_scale).m_backend.exp = (old->m_scale).m_backend.exp;
  (this->m_scale).m_backend.neg = (old->m_scale).m_backend.neg;
  iVar5 = (old->m_scale).m_backend.prec_elem;
  (this->m_scale).m_backend.fpclass = (old->m_scale).m_backend.fpclass;
  (this->m_scale).m_backend.prec_elem = iVar5;
  this->m_isFirst = old->m_isFirst;
  this->m_isLast = old->m_isLast;
  DataArray<int>::DataArray(&this->m_perm,&old->m_perm);
  return;
}

Assistant:

DuplicateColsPS(const DuplicateColsPS& old)
         : PostStep(old)
         , m_j(old.m_j)
         , m_k(old.m_k)
         , m_loJ(old.m_loJ)
         , m_upJ(old.m_upJ)
         , m_loK(old.m_loK)
         , m_upK(old.m_upK)
         , m_scale(old.m_scale)
         , m_isFirst(old.m_isFirst)
         , m_isLast(old.m_isLast)
         , m_perm(old.m_perm)
      {}